

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
calc_avg(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *history,vector<double,_std::allocator<double>_> *new_values,size_t avg_amount)

{
  pointer pvVar1;
  pointer pdVar2;
  long lVar3;
  pointer pdVar4;
  double *pdVar5;
  double *d;
  ulong uVar6;
  double *pdVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  vector<double,_std::allocator<double>_> *__range1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,new_values);
  uVar6 = ((long)(history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
  if (avg_amount <= uVar6) {
    uVar6 = avg_amount;
  }
  if (uVar6 != 0) {
    uVar13 = 0;
    do {
      pvVar1 = (history->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(history->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
               -0x5555555555555555;
      uVar11 = ~(uint)uVar13 + (int)uVar10;
      if (((int)uVar11 < 0) || ((int)uVar10 <= (int)uVar11)) break;
      uVar12 = (ulong)(uVar11 & 0x7fffffff);
      if (uVar10 < uVar12 || uVar10 - uVar12 == 0) {
LAB_00103b7c:
        uVar8 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12);
        pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pdVar2 != (pointer)0x0) {
          operator_delete(pdVar2);
        }
        _Unwind_Resume(uVar8);
      }
      if ((long)*(pointer *)
                 ((long)&pvVar1[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&pvVar1[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data !=
          (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: history and result size mismatch!",0x28);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
      }
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar9 = (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
      if (lVar9 != 0) {
        pvVar1 = (history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(history->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                 -0x5555555555555555;
        if (uVar10 < uVar12 || uVar10 - uVar12 == 0) {
LAB_00103b6b:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar12);
          goto LAB_00103b7c;
        }
        lVar9 = lVar9 >> 3;
        lVar3 = *(long *)&pvVar1[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        pdVar4 = *(pointer *)
                  ((long)&pvVar1[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8);
        uVar12 = 0;
        do {
          if ((long)pdVar4 - lVar3 >> 3 == uVar12) goto LAB_00103b6b;
          pdVar2[uVar12] = *(double *)(lVar3 + uVar12 * 8) + pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != uVar12);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  pdVar7 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar7 != pdVar5) {
    do {
      *pdVar7 = *pdVar7 / (((double)CONCAT44(0x45300000,(int)(uVar6 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> calc_avg(const vector<vector<double>>& history,
                             const vector<double>& new_values,
                             size_t avg_amount) {
    vector<double> result(new_values);

    // If we don't have enough values yet, use what's there (+ 1 because new values)
    avg_amount = std::min(avg_amount, history.size() + 1);

    for (size_t i = 0; i < avg_amount; i++) {
        const int index = history.size() - 1 - i;

        if (index < 0 || index >= (int)history.size()) {
            break;
        }

        if (history.at(index).size() != result.size()) {
            // TODO make this an assert
            cout << "ERROR: history and result size mismatch!" << endl;
        }

        for (size_t j = 0; j < result.size(); j++) {
            result.at(j) += history.at(index).at(j);
        }
    }

    for(double& d : result) {
        d /= avg_amount;
    }

    return result;
}